

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialization_pipeline<Imputer,_IO_FILE*>(Imputer *model,_IO_FILE **in)

{
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Imputer *in_RDI;
  size_t jump_ahead;
  uint8_t ending_type;
  bool diff_endian;
  vector<char,_std::allocator<char>_> buffer;
  size_t size_model;
  uint8_t model_in;
  uint8_t model_type;
  bool lacks_indexer;
  bool lacks_scoring_metric;
  bool lacks_range_penalty;
  PlatformEndianness saved_endian;
  PlatformSize saved_size_t;
  PlatformSize saved_int_t;
  bool has_same_endianness;
  bool has_same_size_t_size;
  bool has_same_int_size;
  SignalSwitcher ss;
  SignalSwitcher *in_stack_fffffffffffffe00;
  SignalSwitcher *this_00;
  bool diff_endian_00;
  vector<char,_std::allocator<char>_> *buffer_00;
  SignalSwitcher *ss_00;
  size_t in_stack_fffffffffffffe18;
  void *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  PlatformSize *in_stack_fffffffffffffe70;
  PlatformSize *in_stack_fffffffffffffe78;
  bool *in_stack_fffffffffffffe80;
  _IO_FILE **in_stack_fffffffffffffe88;
  Imputer *in_stack_fffffffffffffe90;
  _IO_FILE **in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  _IO_FILE **in_stack_fffffffffffffeb8;
  Imputer *in_stack_fffffffffffffec0;
  PlatformEndianness *in_stack_fffffffffffffed0;
  bool *in_stack_fffffffffffffed8;
  bool *in_stack_fffffffffffffee0;
  bool *in_stack_fffffffffffffee8;
  string local_90 [39];
  byte local_69;
  uint8_t local_46;
  uint8_t local_45;
  undefined1 local_33;
  undefined1 local_32 [6];
  int local_2c;
  int local_28;
  byte local_23;
  byte local_22;
  byte local_21;
  Imputer *local_8;
  
  local_8 = in_RDI;
  SignalSwitcher::SignalSwitcher(in_stack_fffffffffffffe00);
  ss_00 = (SignalSwitcher *)&local_33;
  buffer_00 = (vector<char,_std::allocator<char>_> *)local_32;
  this_00 = (SignalSwitcher *)(local_32 + 1);
  check_setup_info<_IO_FILE*>
            (in_stack_fffffffffffffe98,(bool *)in_stack_fffffffffffffe90,
             (bool *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             in_stack_fffffffffffffe70,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,
             in_stack_fffffffffffffee0,in_stack_fffffffffffffee8);
  local_45 = get_model_code(local_8);
  read_bytes<unsigned_char>(ss_00,(size_t)buffer_00,(FILE **)this_00);
  if (local_45 != local_46) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"Object to de-serialize does not match with the supplied type.\n");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((((local_21 & 1) == 0) || ((local_22 & 1) == 0)) || ((local_23 & 1) == 0)) ||
     (((local_32[1] & 1) != 0 || (((byte)local_32[0] & 1) != 0)))) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x64ee64);
    local_69 = (local_23 ^ 0xff) & 1;
    diff_endian_00 = SUB81((ulong)this_00 >> 0x38,0);
    if ((local_28 == 1) && (local_2c == 2)) {
      read_bytes<unsigned_long,unsigned_int>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(FILE **)ss_00,buffer_00,
                 diff_endian_00);
      deserialize_model<_IO_FILE*,short,unsigned_int>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                 (bool)in_stack_fffffffffffffeaf,(bool)in_stack_fffffffffffffeae,
                 (bool)in_stack_fffffffffffffead);
    }
    else if ((local_28 == 2) && (local_2c == 2)) {
      read_bytes<unsigned_long,unsigned_int>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(FILE **)ss_00,buffer_00,
                 diff_endian_00);
      deserialize_model<_IO_FILE*,int,unsigned_int>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                 (bool)in_stack_fffffffffffffeaf,(bool)in_stack_fffffffffffffeae,
                 (bool)in_stack_fffffffffffffead);
    }
    else if ((local_28 == 3) && (local_2c == 2)) {
      read_bytes<unsigned_long,unsigned_int>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(FILE **)ss_00,buffer_00,
                 diff_endian_00);
      deserialize_model<_IO_FILE*,long,unsigned_int>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                 (bool)in_stack_fffffffffffffeaf,(bool)in_stack_fffffffffffffeae,
                 (bool)in_stack_fffffffffffffead);
    }
    else if ((local_28 == 1) && (local_2c == 3)) {
      read_bytes<unsigned_long,unsigned_long>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(FILE **)ss_00,buffer_00,
                 diff_endian_00);
      deserialize_model<_IO_FILE*,short,unsigned_long>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                 (bool)in_stack_fffffffffffffeaf,(bool)in_stack_fffffffffffffeae,
                 (bool)in_stack_fffffffffffffead);
    }
    else if ((local_28 == 2) && (local_2c == 3)) {
      read_bytes<unsigned_long,unsigned_long>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(FILE **)ss_00,buffer_00,
                 diff_endian_00);
      deserialize_model<_IO_FILE*,int,unsigned_long>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                 (bool)in_stack_fffffffffffffeaf,(bool)in_stack_fffffffffffffeae,
                 (bool)in_stack_fffffffffffffead);
    }
    else {
      if ((local_28 != 3) || (local_2c != 3)) {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x10);
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &stack0xfffffffffffffeef;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,(char *)__lhs,(allocator<char> *)__rhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,(char *)__lhs,(allocator<char> *)__rhs);
        std::operator+(__lhs,__rhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,(char *)__lhs,(allocator<char> *)__rhs);
        std::operator+(__lhs,__rhs);
        std::__cxx11::to_string(in_stack_fffffffffffffe4c);
        std::operator+(__lhs,__rhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,(char *)__lhs,(allocator<char> *)__rhs);
        std::operator+(__lhs,__rhs);
        std::runtime_error::runtime_error((runtime_error *)__rhs,local_90);
        __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      read_bytes<unsigned_long,unsigned_long>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(FILE **)ss_00,buffer_00,
                 diff_endian_00);
      deserialize_model<_IO_FILE*,long,unsigned_long>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                 (bool)in_stack_fffffffffffffeaf,(bool)in_stack_fffffffffffffeae,
                 (bool)in_stack_fffffffffffffead);
    }
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)ss_00);
  }
  else {
    read_bytes<unsigned_long>(ss_00,(size_t)buffer_00,(FILE **)this_00);
    deserialize_model<_IO_FILE*>(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  check_interrupt_switch(ss_00);
  if ((local_32[1] & 1) != 0) {
    add_range_penalty(local_8);
    check_interrupt_switch(ss_00);
  }
  read_bytes<unsigned_char>(ss_00,(size_t)buffer_00,(FILE **)this_00);
  read_bytes<unsigned_long>(ss_00,(size_t)buffer_00,(FILE **)this_00);
  SignalSwitcher::~SignalSwitcher(this_00);
  return;
}

Assistant:

void deserialization_pipeline(Model &model, itype &in)
{
    SignalSwitcher ss = SignalSwitcher();

    bool has_same_int_size;
    bool has_same_size_t_size;
    bool has_same_endianness;
    PlatformSize saved_int_t;
    PlatformSize saved_size_t;
    PlatformEndianness saved_endian;
    bool lacks_range_penalty;
    bool lacks_scoring_metric;
    bool lacks_indexer; /* <- ignored */

    check_setup_info(
        in,
        has_same_int_size,
        has_same_size_t_size,
        has_same_endianness,
        saved_int_t,
        saved_size_t,
        saved_endian,
        lacks_range_penalty,
        lacks_scoring_metric,
        lacks_indexer
    );

    uint8_t model_type = get_model_code(model);
    uint8_t model_in;
    read_bytes<uint8_t>((void*)&model_in, (size_t)1, in);
    if (model_type != model_in)
        throw std::runtime_error("Object to de-serialize does not match with the supplied type.\n");

    size_t size_model;
    if (has_same_int_size && has_same_size_t_size && has_same_endianness && !lacks_range_penalty && !lacks_scoring_metric)
    {
        read_bytes<size_t>((void*)&size_model, (size_t)1, in);
        deserialize_model(model, in);
    }
    
    else
    {
        std::vector<char> buffer;
        const bool diff_endian = !has_same_endianness;

        if (saved_int_t == Is16Bit && saved_size_t == Is32Bit)
        {
            read_bytes<size_t, uint32_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int16_t, uint32_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is32Bit && saved_size_t == Is32Bit)
        {
            read_bytes<size_t, uint32_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int32_t, uint32_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is64Bit && saved_size_t == Is32Bit)
        {
            read_bytes<size_t, uint32_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int64_t, uint32_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is16Bit && saved_size_t == Is64Bit)
        {
            read_bytes<size_t, uint64_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int16_t, uint64_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is32Bit && saved_size_t == Is64Bit)
        {
            read_bytes<size_t, uint64_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int32_t, uint64_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is64Bit && saved_size_t == Is64Bit)
        {
            read_bytes<size_t, uint64_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int64_t, uint64_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else
        {
            unexpected_error();
        }
    }

    check_interrupt_switch(ss);

    if (lacks_range_penalty)
    {
        add_range_penalty(model);
        check_interrupt_switch(ss);
    }

    /* Not currently used, but left in case the format changes */
    uint8_t ending_type;
    read_bytes<uint8_t>((void*)&ending_type, (size_t)1, in);
    size_t jump_ahead;
    read_bytes<size_t>((void*)&jump_ahead, (size_t)1, in);
}